

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

reg_desc_t * find_rd_by_name(MIR_context_t ctx,char *name,MIR_func_t func)

{
  reg_desc_t obj;
  int iVar1;
  reg_desc_t *prVar2;
  reg_desc_t local_88;
  reg_desc_t local_70;
  undefined4 local_58;
  undefined4 uStack_54;
  reg_desc_t rd;
  size_t temp_rdn;
  size_t rdn;
  func_regs_t func_regs;
  MIR_func_t func_local;
  char *name_local;
  MIR_context_t ctx_local;
  
  rdn = (size_t)func->internal;
  local_58 = 6;
  uStack_54 = 0;
  rd._0_8_ = name;
  func_regs = (func_regs_t)func;
  func_local = (MIR_func_t)name;
  name_local = (char *)ctx;
  rd.hard_reg_name = (char *)VARR_reg_desc_tlength(*(VARR_reg_desc_t **)rdn);
  obj.reg = uStack_54;
  obj.type = local_58;
  obj.name = (char *)rd._0_8_;
  obj.hard_reg_name = rd.name;
  VARR_reg_desc_tpush(*(VARR_reg_desc_t **)rdn,obj);
  iVar1 = HTAB_size_t_do(*(HTAB_size_t **)(rdn + 8),(size_t)rd.hard_reg_name,HTAB_FIND,&temp_rdn);
  if (iVar1 == 0) {
    VARR_reg_desc_tpop(&local_70,*(VARR_reg_desc_t **)rdn);
    ctx_local = (MIR_context_t)0x0;
  }
  else {
    VARR_reg_desc_tpop(&local_88,*(VARR_reg_desc_t **)rdn);
    prVar2 = VARR_reg_desc_taddr(*(VARR_reg_desc_t **)rdn);
    ctx_local = (MIR_context_t)(prVar2 + temp_rdn);
  }
  return (reg_desc_t *)ctx_local;
}

Assistant:

static reg_desc_t *find_rd_by_name (MIR_context_t ctx MIR_UNUSED, const char *name,
                                    MIR_func_t func) {
  func_regs_t func_regs = func->internal;
  size_t rdn, temp_rdn;
  reg_desc_t rd;

  rd.name = (char *) name;
  rd.type = MIR_T_I64;
  rd.reg = 0; /* to eliminate warnings */
  temp_rdn = VARR_LENGTH (reg_desc_t, func_regs->reg_descs);
  VARR_PUSH (reg_desc_t, func_regs->reg_descs, rd);
  if (!HTAB_DO (size_t, func_regs->name2rdn_tab, temp_rdn, HTAB_FIND, rdn)) {
    VARR_POP (reg_desc_t, func_regs->reg_descs);
    return NULL; /* undeclared */
  }
  VARR_POP (reg_desc_t, func_regs->reg_descs);
  return &VARR_ADDR (reg_desc_t, func_regs->reg_descs)[rdn];
}